

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hh
# Opt level: O1

void __thiscall
tchecker::syncprod::details::
state_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>::
state_pool_allocator_t
          (state_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>
           *this,size_t state_alloc_nb,size_t vloc_alloc_nb,size_t vloc_capacity,size_t table_size)

{
  periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  *__p;
  value_type local_38;
  
  pool_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>::pool_t
            ((pool_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_> *)
             this,state_alloc_nb,0x10);
  this->_vloc_capacity = vloc_capacity;
  pool_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::pool_t
            (&this->_vloc_pool,vloc_alloc_nb,(vloc_capacity & 0xffffffff) * 4 + 0x10);
  __p = (periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
         *)operator_new(0x58);
  (__p->
  super_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  ).super_collectable_t._vptr_collectable_t = (_func_int **)&PTR__cache_t_002169a0;
  std::
  _Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>_>,_std::__detail::_Identity,_tchecker::intrusive_shared_ptr_delegate_equal_to_t,_tchecker::intrusive_shared_ptr_delegate_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>_>,_std::__detail::_Identity,_tchecker::intrusive_shared_ptr_delegate_equal_to_t,_tchecker::intrusive_shared_ptr_delegate_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&(__p->
                   super_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                   )._hashtable,table_size,
               (intrusive_shared_ptr_delegate_hash_t *)
               &(__p->
                super_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                ).field_0x8,
               (key_equal *)
               &(__p->
                super_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                ).field_0x9,(allocator_type *)&local_38);
  (__p->
  super_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  ).super_collectable_t._vptr_collectable_t = (_func_int **)&PTR__cache_t_00216938;
  __p->_period = 1;
  __p->_count = 1;
  (this->_vloc_cache).
  super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>*>
            (&(this->_vloc_cache).
              super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  local_38.super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->_vloc_cache).
       super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_38.super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (this->_vloc_cache).
         super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
  if (local_38.super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_38.super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_38.super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
  ::push_back(&(this->_vloc_pool)._collectables,&local_38);
  if (local_38.super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

state_pool_allocator_t(std::size_t state_alloc_nb, std::size_t vloc_alloc_nb, std::size_t vloc_capacity,
                         std::size_t table_size)
      : tchecker::ts::state_pool_allocator_t<STATE>(state_alloc_nb), _vloc_capacity(vloc_capacity),
        _vloc_pool(vloc_alloc_nb, tchecker::allocation_size_t<tchecker::shared_vloc_t>::alloc_size(_vloc_capacity)),
        _vloc_cache(new vloc_cache_t(table_size))

  {
    _vloc_pool.enroll(_vloc_cache);
  }